

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISceneNode.h
# Opt level: O2

matrix4 * __thiscall
irr::scene::ISceneNode::getRelativeTransformation(matrix4 *__return_storage_ptr__,ISceneNode *this)

{
  float fVar1;
  bool bVar2;
  CMatrix4<float> local_58;
  
  __return_storage_ptr__->M[9] = 0.0;
  __return_storage_ptr__->M[10] = 0.0;
  __return_storage_ptr__->M[0xb] = 0.0;
  __return_storage_ptr__->M[0xc] = 0.0;
  __return_storage_ptr__->M[0xd] = 0.0;
  __return_storage_ptr__->M[0xe] = 0.0;
  __return_storage_ptr__->M[5] = 0.0;
  __return_storage_ptr__->M[6] = 0.0;
  __return_storage_ptr__->M[7] = 0.0;
  __return_storage_ptr__->M[8] = 0.0;
  __return_storage_ptr__->M[1] = 0.0;
  __return_storage_ptr__->M[2] = 0.0;
  __return_storage_ptr__->M[3] = 0.0;
  __return_storage_ptr__->M[4] = 0.0;
  __return_storage_ptr__->M[0xf] = 1.0;
  __return_storage_ptr__->M[10] = 1.0;
  __return_storage_ptr__->M[5] = 1.0;
  __return_storage_ptr__->M[0] = 1.0;
  core::CMatrix4<float>::setRotationDegrees(__return_storage_ptr__,&this->RelativeRotation);
  fVar1 = (this->RelativeTranslation).Y;
  __return_storage_ptr__->M[0xc] = (this->RelativeTranslation).X;
  __return_storage_ptr__->M[0xd] = fVar1;
  __return_storage_ptr__->M[0xe] = (this->RelativeTranslation).Z;
  local_58.M[0] = 1.0;
  local_58.M[1] = 1.0;
  local_58.M[2] = 1.0;
  bVar2 = core::vector3d<float>::operator!=(&this->RelativeScale,(vector3d<float> *)&local_58);
  if (bVar2) {
    local_58.M[0xb] = 0.0;
    local_58.M[0xc] = 0.0;
    local_58.M[7] = 0.0;
    local_58.M[8] = 0.0;
    local_58.M[0xd] = 0.0;
    local_58.M[0xe] = 0.0;
    local_58.M[1] = 0.0;
    local_58.M[2] = 0.0;
    local_58.M[3] = 0.0;
    local_58.M[4] = 0.0;
    local_58.M[0xf] = 1.0;
    local_58.M[0] = (this->RelativeScale).X;
    local_58.M[6] = 0.0;
    local_58.M[5] = (this->RelativeScale).Y;
    local_58.M._36_8_ = (ulong)(uint)(this->RelativeScale).Z << 0x20;
    core::CMatrix4<float>::operator*=(__return_storage_ptr__,&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual core::matrix4 getRelativeTransformation() const
	{
		core::matrix4 mat;
		mat.setRotationDegrees(RelativeRotation);
		mat.setTranslation(RelativeTranslation);

		if (RelativeScale != core::vector3df(1.f, 1.f, 1.f)) {
			core::matrix4 smat;
			smat.setScale(RelativeScale);
			mat *= smat;
		}

		return mat;
	}